

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasisPolynomial.cpp
# Opt level: O1

void __thiscall
BasisPolynomial::BasisPolynomial(BasisPolynomial *this,vector<int,_std::allocator<int>_> *data)

{
  (this->data_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::operator=(&this->data_points,data);
  return;
}

Assistant:

BasisPolynomial::BasisPolynomial(vector<int> data) { // constructor
    BasisPolynomial::data_points = data;
}